

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

void cmQtAutoGeneratorInitializer::InitializeAutogenTarget
               (cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *this;
  cmSourceFile *this_00;
  cmTarget *destinationTarget;
  cmTarget *sourceTarget;
  undefined8 uVar1;
  bool bVar2;
  cmMakefile *this_01;
  char *pcVar3;
  string *psVar4;
  reference pvVar5;
  size_type sVar6;
  cmGlobalGenerator *pcVar7;
  reference ppcVar8;
  char *comment;
  cmGeneratorTarget *pcVar9;
  cmState *pcVar10;
  byte local_843;
  allocator local_6d9;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  allocator local_689;
  string local_688;
  allocator local_661;
  string local_660;
  char *local_640;
  char *autogenFolder;
  cmGeneratorTarget *gt;
  cmTarget *autogenTarget;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  undefined1 local_580 [8];
  string rcc_output_file;
  string rcc_output_dir;
  string basename;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  undefined1 local_4d0 [8];
  string ext;
  string absFile;
  cmSourceFile *sf;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_480;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_478;
  const_iterator fileIt;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  undefined1 local_430 [7];
  bool isNinja;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcc_output;
  undefined1 local_3f8 [8];
  string autogenComment;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  const_iterator local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_378;
  const_iterator local_370;
  undefined1 local_368 [8];
  string tools;
  value_type local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  value_type local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  value_type local_2a0;
  allocator local_279;
  string local_278;
  undefined1 local_258 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toolNames;
  string local_238;
  allocator local_211;
  string local_210;
  char *local_1f0;
  char *autogenDepends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_1c8;
  undefined1 local_1a8 [8];
  string workingDirectory;
  cmCustomCommandLines commandLines;
  value_type local_168;
  allocator local_141;
  value_type local_140;
  allocator local_119;
  value_type local_118;
  undefined1 local_f8 [8];
  cmCustomCommandLine currentLine;
  string targetDir;
  string autogenTargetName;
  string local_98;
  allocator local_75 [20];
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string qtMajorVersion;
  cmMakefile *makefile;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  
  this_01 = cmTarget::GetMakefile(target->Target);
  qtMajorVersion.field_2._8_8_ = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"QT_VERSION_MAJOR",&local_61);
  pcVar3 = cmMakefile::GetSafeDefinition(this_01,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,pcVar3,local_75);
  std::allocator<char>::~allocator((allocator<char> *)local_75);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"");
  uVar1 = qtMajorVersion.field_2._8_8_;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"Qt5Core_VERSION_MAJOR",
               (allocator *)(autogenTargetName.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_98);
    std::__cxx11::string::operator=((string *)local_40,pcVar3);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator
              ((allocator<char> *)(autogenTargetName.field_2._M_local_buf + 0xf));
  }
  GetAutogenTargetName_abi_cxx11_((string *)((long)&targetDir.field_2 + 8),target);
  GetAutogenTargetDir_abi_cxx11_
            ((string *)
             &currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,target);
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_f8);
  psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8,psVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"-E",&local_119);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"cmake_autogen",&local_141);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8,
              (value_type *)
              &currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"$<CONFIGURATION>",
             (allocator *)
             ((long)&commandLines.
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&commandLines.
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this = (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
         ((long)&workingDirectory.field_2 + 8);
  cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)this);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            (this,(value_type *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,"",
             (allocator *)
             ((long)&depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)qtMajorVersion.field_2._8_8_);
  cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_1c8,pcVar3);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&autogenDepends);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"AUTOGEN_TARGET_DEPENDS",&local_211);
  pcVar3 = cmGeneratorTarget::GetProperty(target,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  local_1f0 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_238,pcVar3,
               (allocator *)
               ((long)&toolNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmSystemTools::ExpandListArgument
              (&local_238,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&autogenDepends,false);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&toolNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"AUTOMOC",&local_279);
  bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"moc",&local_2a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"AUTOUIC",&local_2c9);
  bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"uic",&local_2f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"AUTORCC",&local_319);
  bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_340,"rcc",(allocator *)(tools.field_2._M_local_buf + 0xf));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)(tools.field_2._M_local_buf + 0xf));
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_258,0);
  std::__cxx11::string::string((string *)local_368,(string *)pvVar5);
  local_378._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_258);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_370,&local_378);
  local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_258,local_370);
  while (sVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_258), 1 < sVar6) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_258,0);
    std::operator+(&local_3a0,", ",pvVar5);
    std::__cxx11::string::operator+=((string *)local_368,(string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    local_3b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_3a8,&local_3b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258,local_3a8);
  }
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258);
  if (sVar6 == 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_258,0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&autogenComment.field_2 + 8)," and ",pvVar5);
    std::__cxx11::string::operator+=
              ((string *)local_368,(string *)(autogenComment.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(autogenComment.field_2._M_local_buf + 8));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &rcc_output.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"Automatic ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &rcc_output.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage," for target ");
  std::__cxx11::string::~string
            ((string *)
             &rcc_output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::operator+=((string *)local_3f8,(string *)psVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_430);
  pcVar7 = cmLocalGenerator::GetGlobalGenerator(lg);
  (*pcVar7->_vptr_cmGlobalGenerator[3])
            (&srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &srcFiles.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,"Ninja");
  std::__cxx11::string::~string
            ((string *)
             &srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
    cmGeneratorTarget::GetConfigCommonSourceFiles
              (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
    local_480._M_current =
         (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
    __gnu_cxx::
    __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
    ::__normal_iterator<cmSourceFile**>
              ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                *)&local_478,&local_480);
    while( true ) {
      sf = (cmSourceFile *)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
      bVar2 = __gnu_cxx::operator!=
                        (&local_478,
                         (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                          *)&sf);
      if (!bVar2) break;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&local_478);
      this_00 = *ppcVar8;
      psVar4 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
      cmsys::SystemTools::GetRealPath((string *)((long)&ext.field_2 + 8),psVar4,(string *)0x0);
      psVar4 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
      std::__cxx11::string::string((string *)local_4d0,(string *)psVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4f0,"AUTORCC",&local_4f1);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      if (bVar2) {
        basename.field_2._M_local_buf[0xe] = '\0';
        basename.field_2._M_local_buf[0xd] = '\0';
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4d0,"qrc");
        local_843 = 0;
        if (bVar2) {
          std::allocator<char>::allocator();
          basename.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string
                    ((string *)&local_518,"SKIP_AUTORCC",
                     (allocator *)(basename.field_2._M_local_buf + 0xf));
          basename.field_2._M_local_buf[0xd] = '\x01';
          pcVar3 = cmSourceFile::GetPropertyForUser(this_00,&local_518);
          bVar2 = cmSystemTools::IsOn(pcVar3);
          local_843 = bVar2 ^ 0xff;
        }
        if ((basename.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_518);
        }
        if ((basename.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(basename.field_2._M_local_buf + 0xf))
          ;
        }
        if ((local_843 & 1) != 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension
                    ((string *)((long)&rcc_output_dir.field_2 + 8),
                     (string *)((long)&ext.field_2 + 8));
          cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                    ((string *)((long)&rcc_output_file.field_2 + 8),target);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::MakeDirectory(pcVar3);
          std::__cxx11::string::string
                    ((string *)local_580,(string *)(rcc_output_file.field_2._M_local_buf + 8));
          std::operator+(&local_5c0,"/qrc_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&rcc_output_dir.field_2 + 8));
          std::operator+(&local_5a0,&local_5c0,".cpp");
          std::__cxx11::string::operator+=((string *)local_580,(string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_430,(value_type *)local_580);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_5e0,"GENERATED",&local_5e1);
          pcVar3 = cmSourceFile::GetPropertyForUser(this_00,&local_5e0);
          bVar2 = cmSystemTools::IsOn(pcVar3);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"5");
            if (bVar2) {
              ListQt5RccInputs(&local_608,this_00,target,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&autogenDepends);
              std::__cxx11::string::~string((string *)&local_608);
            }
            else {
              ListQt4RccInputs((string *)&autogenTarget,this_00,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&autogenDepends);
              std::__cxx11::string::~string((string *)&autogenTarget);
            }
          }
          std::__cxx11::string::~string((string *)local_580);
          std::__cxx11::string::~string((string *)(rcc_output_file.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(rcc_output_dir.field_2._M_local_buf + 8));
        }
      }
      std::__cxx11::string::~string((string *)local_4d0);
      std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&local_478);
    }
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&fileIt);
  }
  uVar1 = qtMajorVersion.field_2._8_8_;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  comment = (char *)std::__cxx11::string::c_str();
  gt = (cmGeneratorTarget *)
       cmMakefile::AddUtilityCommand
                 ((cmMakefile *)uVar1,(string *)((long)&targetDir.field_2 + 8),true,pcVar3,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_430,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&autogenDepends,(cmCustomCommandLines *)((long)&workingDirectory.field_2 + 8),
                  false,comment,false);
  pcVar9 = (cmGeneratorTarget *)operator_new(0x500);
  cmGeneratorTarget::cmGeneratorTarget(pcVar9,(cmTarget *)gt,lg);
  autogenFolder = (char *)pcVar9;
  cmLocalGenerator::AddGeneratorTarget(lg,pcVar9);
  pcVar10 = cmMakefile::GetState((cmMakefile *)qtMajorVersion.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_660,"AUTOMOC_TARGETS_FOLDER",&local_661);
  pcVar3 = cmState::GetGlobalProperty(pcVar10,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  local_640 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = cmMakefile::GetState((cmMakefile *)qtMajorVersion.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_688,"AUTOGEN_TARGETS_FOLDER",&local_689);
    local_640 = cmState::GetGlobalProperty(pcVar10,&local_688);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
  }
  pcVar9 = gt;
  if ((local_640 == (char *)0x0) || (*local_640 == '\0')) {
    destinationTarget = *(cmTarget **)autogenFolder;
    sourceTarget = target->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6d8,"FOLDER",&local_6d9);
    copyTargetProperty(destinationTarget,sourceTarget,&local_6d8);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b0,"FOLDER",&local_6b1);
    cmTarget::SetProperty((cmTarget *)pcVar9,&local_6b0,local_640);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  }
  cmTarget::AddUtility(target->Target,(string *)((long)&targetDir.field_2 + 8),(cmMakefile *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_430);
  std::__cxx11::string::~string((string *)local_3f8);
  std::__cxx11::string::~string((string *)local_368);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&autogenDepends);
  std::__cxx11::string::~string((string *)local_1a8);
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)((long)&workingDirectory.field_2 + 8));
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_f8);
  std::__cxx11::string::~string
            ((string *)
             &currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(targetDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::InitializeAutogenTarget(
                                                 cmLocalGenerator* lg,
                                                 cmGeneratorTarget* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  std::string qtMajorVersion = makefile->GetSafeDefinition("QT_VERSION_MAJOR");
  if (qtMajorVersion == "")
    {
    qtMajorVersion = makefile->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
    }

  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = GetAutogenTargetName(target);

  std::string targetDir = GetAutogenTargetDir(target);

  cmCustomCommandLine currentLine;
  currentLine.push_back(cmSystemTools::GetCMakeCommand());
  currentLine.push_back("-E");
  currentLine.push_back("cmake_autogen");
  currentLine.push_back(targetDir);
  currentLine.push_back("$<CONFIGURATION>");

  cmCustomCommandLines commandLines;
  commandLines.push_back(currentLine);

  std::string workingDirectory = cmSystemTools::CollapseFullPath(
                                    "", makefile->GetCurrentBinaryDirectory());

  std::vector<std::string> depends;
  if (const char *autogenDepends =
                                target->GetProperty("AUTOGEN_TARGET_DEPENDS"))
    {
    cmSystemTools::ExpandListArgument(autogenDepends, depends);
    }
  std::vector<std::string> toolNames;
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    toolNames.push_back("moc");
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    toolNames.push_back("uic");
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    toolNames.push_back("rcc");
    }

  std::string tools = toolNames[0];
  toolNames.erase(toolNames.begin());
  while (toolNames.size() > 1)
    {
    tools += ", " + toolNames[0];
    toolNames.erase(toolNames.begin());
    }
  if (toolNames.size() == 1)
    {
    tools += " and " + toolNames[0];
    }
  std::string autogenComment = "Automatic " + tools + " for target ";
  autogenComment += target->GetName();

#if defined(_WIN32) && !defined(__CYGWIN__)
  bool usePRE_BUILD = false;
  cmGlobalGenerator* gg = lg->GetGlobalGenerator();
  if(gg->GetName().find("Visual Studio") != std::string::npos)
    {
    cmGlobalVisualStudioGenerator* vsgg =
      static_cast<cmGlobalVisualStudioGenerator*>(gg);
    // Under VS >= 7 use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = vsgg->GetVersion() >= cmGlobalVisualStudioGenerator::VS7;
    if(usePRE_BUILD)
      {
      for (std::vector<std::string>::iterator it = depends.begin();
            it != depends.end(); ++it)
        {
        if(!makefile->FindTargetToUse(it->c_str()))
          {
          usePRE_BUILD = false;
          break;
          }
        }
      }
    }
#endif

  std::vector<std::string> rcc_output;
  bool const isNinja =
    lg->GetGlobalGenerator()->GetName() == "Ninja";
  if(isNinja
#if defined(_WIN32) && !defined(__CYGWIN__)
        || usePRE_BUILD
#endif
        )
    {
    std::vector<cmSourceFile*> srcFiles;
    target->GetConfigCommonSourceFiles(srcFiles);
    for(std::vector<cmSourceFile*>::const_iterator fileIt = srcFiles.begin();
        fileIt != srcFiles.end();
        ++fileIt)
      {
      cmSourceFile* sf = *fileIt;
      std::string absFile = cmsys::SystemTools::GetRealPath(
                                                sf->GetFullPath());

      std::string ext = sf->GetExtension();

      if (target->GetPropertyAsBool("AUTORCC"))
        {
        if (ext == "qrc"
            && !cmSystemTools::IsOn(sf->GetPropertyForUser("SKIP_AUTORCC")))
          {
          std::string basename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(absFile);

          std::string rcc_output_dir = target->GetSupportDirectory();
          cmSystemTools::MakeDirectory(rcc_output_dir.c_str());
          std::string rcc_output_file = rcc_output_dir;
          rcc_output_file += "/qrc_" + basename + ".cpp";
          rcc_output.push_back(rcc_output_file);

          if (!cmSystemTools::IsOn(sf->GetPropertyForUser("GENERATED")))
            {
            if (qtMajorVersion == "5")
              {
              ListQt5RccInputs(sf, target, depends);
              }
            else
              {
              ListQt4RccInputs(sf, depends);
              }
#if defined(_WIN32) && !defined(__CYGWIN__)
            // Cannot use PRE_BUILD because the resource files themselves
            // may not be sources within the target so VS may not know the
            // target needs to re-build at all.
            usePRE_BUILD = false;
#endif
            }
          }
        }
      }
    }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if(usePRE_BUILD)
    {
    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    std::vector<std::string> no_output;
    std::vector<std::string> no_byproducts;
    cmCustomCommand cc(makefile, no_output, no_byproducts, depends,
                       commandLines, autogenComment.c_str(),
                       workingDirectory.c_str());
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    target->Target->AddPreBuildCommand(cc);
    }
  else
#endif
    {
    cmTarget* autogenTarget = makefile->AddUtilityCommand(
                                autogenTargetName, true,
                                workingDirectory.c_str(),
                                /*byproducts=*/rcc_output, depends,
                                commandLines, false, autogenComment.c_str());

    cmGeneratorTarget* gt = new cmGeneratorTarget(autogenTarget, lg);
    lg->AddGeneratorTarget(gt);

    // Set target folder
    const char* autogenFolder = makefile->GetState()
                                ->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!autogenFolder)
      {
      autogenFolder = makefile->GetState()
                                ->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      }
    if (autogenFolder && *autogenFolder)
      {
      autogenTarget->SetProperty("FOLDER", autogenFolder);
      }
    else
      {
      // inherit FOLDER property from target (#13688)
      copyTargetProperty(gt->Target, target->Target, "FOLDER");
      }

    target->Target->AddUtility(autogenTargetName);
    }
}